

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

void __thiscall IMLE::setParameters(IMLE *this,Param *prm)

{
  X *this_00;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  int iVar6;
  bool bVar7;
  undefined7 uVar8;
  Index index;
  ulong uVar9;
  long lVar10;
  ulong rows;
  Scal *pSVar11;
  Scal *pSVar12;
  ActualDstType actualDst;
  byte bVar13;
  string local_40;
  
  bVar13 = 0;
  if ((prm->d == this->d) && (prm->D == this->D)) {
    (this->param).alpha = prm->alpha;
    iVar6 = prm->D;
    bVar7 = prm->accelerated;
    uVar8 = *(undefined7 *)&prm->field_0x9;
    (this->param).d = prm->d;
    (this->param).D = iVar6;
    (this->param).accelerated = bVar7;
    *(undefined7 *)&(this->param).field_0x9 = uVar8;
    this_00 = &(this->param).Psi0;
    pdVar3 = (prm->Psi0).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    rows = (prm->Psi0).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
    if ((this->param).Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows,1);
      rows = (this->param).Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    }
    pdVar4 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar9 = rows - ((long)rows >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)rows) {
      lVar10 = 0;
      do {
        pdVar1 = pdVar3 + lVar10;
        dVar5 = pdVar1[1];
        pdVar2 = pdVar4 + lVar10;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar5;
        lVar10 = lVar10 + 2;
      } while (lVar10 < (long)uVar9);
    }
    if ((long)uVar9 < (long)rows) {
      do {
        pdVar4[uVar9] = pdVar3[uVar9];
        uVar9 = uVar9 + 1;
      } while (rows != uVar9);
    }
    pSVar11 = &prm->sigma0;
    pSVar12 = &(this->param).sigma0;
    for (lVar10 = 0xb; lVar10 != 0; lVar10 = lVar10 + -1) {
      *pSVar12 = *pSVar11;
      pSVar11 = pSVar11 + (ulong)bVar13 * -2 + 1;
      pSVar12 = pSVar12 + (ulong)bVar13 * -2 + 1;
    }
    (this->param).saveOnExit = prm->saveOnExit;
    (this->param).iterMax = prm->iterMax;
    std::__cxx11::string::_M_assign((string *)&(this->param).defaultSave);
    set_internal_parameters(this);
    return;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"IMLE::setParameters: parameter dimensions do not match!!","");
  message(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::setParameters(Param const &prm)
{
#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( prm.d != d || prm.D != D)
    {
        message("IMLE::setParameters: parameter dimensions do not match!!");
        return;
    }
#endif

    param = prm;
    set_internal_parameters();
}